

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O1

pair<bool,_const_char_*> consistentProperty<char_const*>(char *lhs,char *rhs,CompatibleType t)

{
  int iVar1;
  undefined7 uVar3;
  undefined8 uVar2;
  undefined4 extraout_var;
  pair<bool,_const_char_*> pVar4;
  
  uVar3 = (undefined7)(((ulong)lhs | (ulong)rhs) >> 8);
  if (((ulong)lhs | (ulong)rhs) != 0) {
    if (lhs == (char *)0x0) {
      uVar2 = CONCAT71(uVar3,1);
      lhs = rhs;
      goto LAB_0036dd51;
    }
    if (rhs != (char *)0x0) {
      if (t - NumberMinType < 2) {
        pVar4 = consistentNumberProperty(lhs,rhs,t);
        return pVar4;
      }
      if (t != StringType) {
        if (t == BoolType) {
          __assert_fail("0 && \"consistentProperty for strings called with BoolType\"",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmTarget.cxx"
                        ,0x1293,
                        "std::pair<bool, const char *> consistentProperty(const char *, const char *, CompatibleType)"
                       );
        }
        __assert_fail("0 && \"Unreachable!\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmTarget.cxx"
                      ,0x129b,
                      "std::pair<bool, const char *> consistentProperty(const char *, const char *, CompatibleType)"
                     );
      }
      iVar1 = strcmp(lhs,rhs);
      uVar2 = CONCAT71((int7)(CONCAT44(extraout_var,iVar1) >> 8),iVar1 == 0);
      if (iVar1 != 0) {
        lhs = (char *)0x0;
      }
      goto LAB_0036dd51;
    }
  }
  uVar2 = CONCAT71(uVar3,1);
LAB_0036dd51:
  pVar4.second = lhs;
  pVar4._0_8_ = uVar2;
  return pVar4;
}

Assistant:

std::pair<bool, const char*> consistentProperty(const char *lhs,
                                                const char *rhs,
                                                CompatibleType t)
{
  if (!lhs && !rhs)
    {
    return std::make_pair(true, lhs);
    }
  if (!lhs)
    {
    return std::make_pair(true, rhs);
    }
  if (!rhs)
    {
    return std::make_pair(true, lhs);
    }

  const char* const null_ptr = 0;

  switch(t)
  {
  case BoolType:
    assert(0 && "consistentProperty for strings called with BoolType");
    return std::pair<bool, const char*>(false, null_ptr);
  case StringType:
    return consistentStringProperty(lhs, rhs);
  case NumberMinType:
  case NumberMaxType:
    return consistentNumberProperty(lhs, rhs, t);
  }
  assert(0 && "Unreachable!");
  return std::pair<bool, const char*>(false, null_ptr);
}